

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O1

string * __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,GPUShader5ImplicitConversionsTest *this,
          GLchar *destination_type,GLchar *source_type)

{
  int iVar1;
  char *text;
  size_t search_position;
  size_t local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 130\n#extension GL_ARB_gpu_shader5 : require\n\nuniform SOURCE_TYPE u1;\nuniform SOURCE_TYPE u2;\n\nout     vec4 result;\n\nvoid main()\n{\n    DESTINATION_TYPE v = ZERO;\n\n    v = DESTINATION_TYPE(u2) - u1;\n\n    result = vec4(0.0, 0.0, 0.0, 0.0);\n    if (ZERO == v)\n    {\n      result = vec4(1.0, 1.0, 1.0, 1.0);\n    }\n\n    switch (gl_VertexID)\n    {\n      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n    }\n}\n\n"
             ,"");
  local_28 = 0;
  Utils::replaceToken("SOURCE_TYPE",&local_28,source_type,__return_storage_ptr__);
  Utils::replaceToken("SOURCE_TYPE",&local_28,source_type,__return_storage_ptr__);
  local_28 = 0;
  Utils::replaceToken("DESTINATION_TYPE",&local_28,destination_type,__return_storage_ptr__);
  Utils::replaceToken("DESTINATION_TYPE",&local_28,destination_type,__return_storage_ptr__);
  local_28 = 0;
  iVar1 = strcmp(destination_type,"int");
  if ((iVar1 == 0) || (iVar1 = strcmp(destination_type,"uint"), iVar1 == 0)) {
    text = "0";
    Utils::replaceToken("ZERO",&local_28,"0",__return_storage_ptr__);
  }
  else {
    iVar1 = strcmp(destination_type,"float");
    if (iVar1 == 0) {
      text = "0.0";
      Utils::replaceToken("ZERO",&local_28,"0.0",__return_storage_ptr__);
    }
    else {
      iVar1 = strcmp(destination_type,"ivec2");
      if (iVar1 == 0) {
        text = "ivec2(0,0)";
        Utils::replaceToken("ZERO",&local_28,"ivec2(0,0)",__return_storage_ptr__);
      }
      else {
        iVar1 = strcmp(destination_type,"ivec3");
        if (iVar1 == 0) {
          text = "ivec3(0,0,0)";
          Utils::replaceToken("ZERO",&local_28,"ivec3(0,0,0)",__return_storage_ptr__);
        }
        else {
          iVar1 = strcmp(destination_type,"ivec4");
          if (iVar1 == 0) {
            text = "ivec4(0,0,0,0)";
            Utils::replaceToken("ZERO",&local_28,"ivec4(0,0,0,0)",__return_storage_ptr__);
          }
          else {
            iVar1 = strcmp(destination_type,"uvec2");
            if (iVar1 == 0) {
              text = "uvec2(0,0)";
              Utils::replaceToken("ZERO",&local_28,"uvec2(0,0)",__return_storage_ptr__);
            }
            else {
              iVar1 = strcmp(destination_type,"uvec3");
              if (iVar1 == 0) {
                text = "uvec3(0,0,0)";
                Utils::replaceToken("ZERO",&local_28,"uvec3(0,0,0)",__return_storage_ptr__);
              }
              else {
                iVar1 = strcmp(destination_type,"uvec4");
                if (iVar1 == 0) {
                  text = "uvec4(0,0,0,0)";
                  Utils::replaceToken("ZERO",&local_28,"uvec4(0,0,0,0)",__return_storage_ptr__);
                }
                else {
                  iVar1 = strcmp(destination_type,"vec2");
                  if (iVar1 == 0) {
                    text = "vec2(0,0)";
                    Utils::replaceToken("ZERO",&local_28,"vec2(0,0)",__return_storage_ptr__);
                  }
                  else {
                    iVar1 = strcmp(destination_type,"vec3");
                    if (iVar1 == 0) {
                      text = "vec3(0,0,0)";
                      Utils::replaceToken("ZERO",&local_28,"vec3(0,0,0)",__return_storage_ptr__);
                    }
                    else {
                      iVar1 = strcmp(destination_type,"vec4");
                      if (iVar1 != 0) {
                        return __return_storage_ptr__;
                      }
                      text = "vec4(0,0,0,0)";
                      Utils::replaceToken("ZERO",&local_28,"vec4(0,0,0,0)",__return_storage_ptr__);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Utils::replaceToken("ZERO",&local_28,text,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShader5ImplicitConversionsTest::getVertexShader(const glw::GLchar* destination_type,
															   const glw::GLchar* source_type)
{
	/* Vertex shader template */
	const char* vs_body_template = "#version 130\n"
								   "#extension GL_ARB_gpu_shader5 : require\n"
								   "\n"
								   "uniform SOURCE_TYPE u1;\n"
								   "uniform SOURCE_TYPE u2;\n"
								   "\n"
								   "out     vec4 result;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    DESTINATION_TYPE v = ZERO;\n"
								   "\n"
								   "    v = DESTINATION_TYPE(u2) - u1;\n"
								   "\n"
								   "    result = vec4(0.0, 0.0, 0.0, 0.0);\n"
								   "    if (ZERO == v)\n"
								   "    {\n"
								   "      result = vec4(1.0, 1.0, 1.0, 1.0);\n"
								   "    }\n"
								   "\n"
								   "    switch (gl_VertexID)\n"
								   "    {\n"
								   "      case 0: gl_Position = vec4(-1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 1: gl_Position = vec4( 1.0, 1.0, 0.0, 1.0); break; \n"
								   "      case 2: gl_Position = vec4(-1.0,-1.0, 0.0, 1.0); break; \n"
								   "      case 3: gl_Position = vec4( 1.0,-1.0, 0.0, 1.0); break; \n"
								   "    }\n"
								   "}\n"
								   "\n";

	std::string vs_body = vs_body_template;

	/* Tokens */
	size_t search_position = 0;

	Utils::replaceToken("SOURCE_TYPE", search_position, source_type, vs_body);
	Utils::replaceToken("SOURCE_TYPE", search_position, source_type, vs_body);

	search_position = 0;
	Utils::replaceToken("DESTINATION_TYPE", search_position, destination_type, vs_body);
	Utils::replaceToken("DESTINATION_TYPE", search_position, destination_type, vs_body);

	search_position = 0;
	if (!strcmp(destination_type, "int") || !strcmp(destination_type, "uint"))
	{
		Utils::replaceToken("ZERO", search_position, "0", vs_body);
		Utils::replaceToken("ZERO", search_position, "0", vs_body);
	}
	else if (!strcmp(destination_type, "float"))
	{
		Utils::replaceToken("ZERO", search_position, "0.0", vs_body);
		Utils::replaceToken("ZERO", search_position, "0.0", vs_body);
	}
	else if (!strcmp(destination_type, "ivec2"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "ivec3"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "ivec4"))
	{
		Utils::replaceToken("ZERO", search_position, "ivec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "ivec4(0,0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec2"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec3"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "uvec4"))
	{
		Utils::replaceToken("ZERO", search_position, "uvec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "uvec4(0,0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec2"))
	{
		Utils::replaceToken("ZERO", search_position, "vec2(0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec2(0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec3"))
	{
		Utils::replaceToken("ZERO", search_position, "vec3(0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec3(0,0,0)", vs_body);
	}
	else if (!strcmp(destination_type, "vec4"))
	{
		Utils::replaceToken("ZERO", search_position, "vec4(0,0,0,0)", vs_body);
		Utils::replaceToken("ZERO", search_position, "vec4(0,0,0,0)", vs_body);
	}

	return vs_body;
}